

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_side_has_id(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT id,REF_BOOL *has_id)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  *has_id = 0;
  if (ref_cell->last_node_is_an_id != 0) {
    iVar6 = -1;
    uVar7 = 0xffffffff;
    if (-1 < node0) {
      pRVar2 = ref_cell->ref_adj;
      uVar7 = 0xffffffff;
      iVar6 = -1;
      if (node0 < pRVar2->nnode) {
        uVar1 = pRVar2->first[(uint)node0];
        uVar7 = 0xffffffff;
        iVar6 = -1;
        if ((long)(int)uVar1 != -1) {
          iVar6 = pRVar2->item[(int)uVar1].ref;
          uVar7 = (ulong)uVar1;
        }
      }
    }
    while ((int)uVar7 != -1) {
      uVar1 = ref_cell->edge_per;
      if (ref_cell->edge_per < 1) {
        uVar1 = 0;
      }
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        pRVar3 = ref_cell->e2n;
        pRVar4 = ref_cell->c2n;
        lVar8 = (long)ref_cell->size_per * (long)iVar6;
        lVar9 = (long)(int)lVar8;
        if ((((pRVar4[lVar8 + pRVar3[uVar10 * 2]] == node0) &&
             (pRVar4[pRVar3[uVar10 * 2 + 1] + lVar9] == node1)) ||
            ((pRVar4[lVar8 + pRVar3[uVar10 * 2]] == node1 &&
             (pRVar4[pRVar3[uVar10 * 2 + 1] + lVar9] == node0)))) &&
           (pRVar4[ref_cell->node_per + lVar9] == id)) {
          *has_id = 1;
          return 0;
        }
      }
      pRVar5 = ref_cell->ref_adj->item;
      uVar7 = (ulong)pRVar5[(int)uVar7].next;
      iVar6 = -1;
      if (uVar7 != 0xffffffffffffffff) {
        iVar6 = pRVar5[uVar7].ref;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_side_has_id(REF_CELL ref_cell, REF_INT node0,
                                        REF_INT node1, REF_INT id,
                                        REF_BOOL *has_id) {
  REF_INT item, cell;
  REF_INT cell_edge;

  *has_id = REF_FALSE;

  if (!ref_cell_last_node_is_an_id(ref_cell)) return REF_SUCCESS;

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), node0, item, cell)
      each_ref_cell_cell_edge(
          ref_cell,
          cell_edge) if ((node0 == ref_cell_e2n(ref_cell, 0, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 1, cell_edge, cell)) ||
                         (node0 == ref_cell_e2n(ref_cell, 1, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(
                                  ref_cell, 0, cell_edge,
                                  cell))) if (id ==
                                              ref_cell_c2n(
                                                  ref_cell,
                                                  ref_cell_node_per(ref_cell),
                                                  cell)) {
    *has_id = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}